

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwd_txfm_impl_sse2.h
# Opt level: O0

void aom_fdct4x4_sse2(int16_t *input,tran_low_t *output,int stride)

{
  tran_low_t *in_RSI;
  __m128i in1;
  __m128i in0;
  __m128i *in_stack_00000248;
  __m128i *in_stack_00000250;
  int in_stack_0000025c;
  int16_t *in_stack_00000260;
  longlong alStack_38 [2];
  longlong local_28 [3];
  tran_low_t *local_10;
  
  local_10 = in_RSI;
  fdct4x4_helper(in_stack_00000260,in_stack_0000025c,in_stack_00000250,in_stack_00000248);
  storeu_output((__m128i *)local_28,local_10);
  storeu_output(&alStack_38,local_10 + 8);
  return;
}

Assistant:

void FDCT4x4_2D(const int16_t *input, tran_low_t *output, int stride) {
  // This 2D transform implements 4 vertical 1D transforms followed
  // by 4 horizontal 1D transforms.  The multiplies and adds are as given
  // by Chen, Smith and Fralick ('77).  The commands for moving the data
  // around have been minimized by hand.
  // For the purposes of the comments, the 16 inputs are referred to at i0
  // through iF (in raster order), intermediate variables are a0, b0, c0
  // through f, and correspond to the in-place computations mapped to input
  // locations.  The outputs, o0 through oF are labeled according to the
  // output locations.
  __m128i in0, in1;
  FDCT4x4_2D_HELPER(input, stride, &in0, &in1);

  // Post-condition (v + 1) >> 2 is now incorporated into previous
  // add and right-shift commands.  Only 2 store instructions needed
  // because we are using the fact that 1/3 are stored just after 0/2.
  storeu_output(&in0, output + 0 * 4);
  storeu_output(&in1, output + 2 * 4);
}